

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O0

void __thiscall QRadioButton::mouseMoveEvent(QRadioButton *this,QMouseEvent *e)

{
  bool bVar1;
  byte bVar2;
  QWidget *this_00;
  QPointF *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool hit;
  QRadioButtonPrivate *d;
  WidgetAttribute in_stack_ffffffffffffffc4;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)d_func((QRadioButton *)0x66832e);
  bVar1 = QWidget::testAttribute(this_00,in_stack_ffffffffffffffc4);
  if (bVar1) {
    bVar2 = 0;
    bVar1 = QWidget::underMouse((QWidget *)0x668358);
    if (bVar1) {
      QSinglePointEvent::position((QSinglePointEvent *)0x668368);
      local_10 = QPointF::toPoint(in_RSI);
      bVar2 = (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,&local_10);
      bVar2 = bVar2 & 1;
    }
    if ((bVar2 & 1) != (this_00[0x11].field_0xc & 1)) {
      QWidget::update(in_RDI);
      this_00[0x11].field_0xc = this_00[0x11].field_0xc & 0xfe | bVar2 & 1;
    }
  }
  QAbstractButton::mouseMoveEvent((QAbstractButton *)in_RSI,(QMouseEvent *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRadioButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QRadioButton);
    if (testAttribute(Qt::WA_Hover)) {
        bool hit = false;
        if (underMouse())
            hit = hitButton(e->position().toPoint());

        if (hit != d->hovering) {
            update();
            d->hovering = hit;
        }
    }

    QAbstractButton::mouseMoveEvent(e);
}